

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

void cf_hc_close(Curl_cfilter *cf,Curl_easy *data)

{
  Curl_cfilter *pCVar1;
  
  if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
      ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"close");
  }
  cf_hc_reset(cf,data);
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  pCVar1 = cf->next;
  if (pCVar1 != (Curl_cfilter *)0x0) {
    (*(code *)pCVar1->cft->do_close)(pCVar1,data);
    Curl_conn_cf_discard_chain(&cf->next,data);
    return;
  }
  return;
}

Assistant:

static void cf_hc_close(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  CURL_TRC_CF(data, cf, "close");
  cf_hc_reset(cf, data);
  cf->connected = FALSE;

  if(cf->next) {
    cf->next->cft->do_close(cf->next, data);
    Curl_conn_cf_discard_chain(&cf->next, data);
  }
}